

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

int __thiscall
ncnn::NetPrivate::convert_layout(NetPrivate *this,Mat *bottom_blob,Layer *layer,Option *opt)

{
  int iVar1;
  int iVar2;
  long in_RCX;
  long in_RDX;
  Mat *in_RSI;
  Mat bottom_blob_packed;
  int dst_elempack;
  int elembits;
  int elemcount;
  int dims;
  Mat bottom_blob_fp32;
  Mat bottom_blob_bf16;
  Mat *in_stack_fffffffffffffed0;
  Mat *this_00;
  Mat *in_stack_fffffffffffffed8;
  Option *in_stack_fffffffffffffef8;
  int in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff04;
  Mat *in_stack_ffffffffffffff08;
  Mat *in_stack_ffffffffffffff10;
  int local_d0;
  int local_c8;
  Mat local_c0;
  Mat local_68;
  long local_20;
  long local_18;
  Mat *local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  if ((*(byte *)(in_RCX + 0x20) & 1) != 0) {
    iVar1 = Mat::elembits(in_RSI);
    if ((iVar1 == 0x20) && ((*(byte *)(local_18 + 0xc) & 1) != 0)) {
      Mat::Mat(&local_68);
      cast_float32_to_bfloat16
                (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                 (Option *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
      Mat::operator=(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
      Mat::~Mat((Mat *)0x19774f);
    }
    iVar1 = Mat::elembits(local_10);
    if ((iVar1 == 0x10) && ((*(byte *)(local_18 + 0xc) & 1) == 0)) {
      in_stack_fffffffffffffed8 = &local_c0;
      Mat::Mat(in_stack_fffffffffffffed8);
      cast_bfloat16_to_float32
                (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                 (Option *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
      Mat::operator=(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
      Mat::~Mat((Mat *)0x1977e0);
    }
  }
  if ((*(byte *)(local_20 + 0x27) & 1) != 0) {
    iVar1 = local_10->dims;
    local_c8 = 0;
    if (iVar1 == 1) {
      local_c8 = local_10->elempack * local_10->w;
    }
    if (iVar1 == 2) {
      local_c8 = local_10->elempack * local_10->h;
    }
    if (iVar1 == 3) {
      local_c8 = local_10->elempack * local_10->c;
    }
    iVar1 = Mat::elembits(local_10);
    local_d0 = 1;
    if ((*(byte *)(local_18 + 0xb) & 1) != 0) {
      if (iVar1 == 0x20) {
        if ((local_c8 % 8 == 0) &&
           ((iVar2 = cpu_support_x86_avx2(), iVar2 != 0 ||
            (iVar2 = cpu_support_x86_avx(), iVar2 != 0)))) {
          local_d0 = 8;
        }
        else if (local_c8 % 4 == 0) {
          local_d0 = 4;
        }
      }
      if ((iVar1 == 0x10) && (local_c8 % 4 == 0)) {
        local_d0 = 4;
      }
      if ((iVar1 == 8) && (local_c8 % 8 == 0)) {
        local_d0 = 8;
      }
    }
    if (local_10->elempack != local_d0) {
      this_00 = (Mat *)&stack0xfffffffffffffee8;
      Mat::Mat(this_00);
      convert_packing(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff04,
                      in_stack_fffffffffffffef8);
      Mat::operator=(in_stack_fffffffffffffed8,this_00);
      Mat::~Mat((Mat *)0x1979ba);
    }
  }
  return 0;
}

Assistant:

int NetPrivate::convert_layout(Mat& bottom_blob, const Layer* layer, const Option& opt) const
{
    // clang-format off
    // *INDENT-OFF*
#if NCNN_ARM82
    if (opt.use_fp16_storage && cpu_support_arm_asimdhp())
    {
        if (bottom_blob.elembits() == 32 && layer->support_fp16_storage)
        {
            Mat bottom_blob_fp16;
            cast_float32_to_float16(bottom_blob, bottom_blob_fp16, opt);
            bottom_blob = bottom_blob_fp16;
        }
        if (bottom_blob.elembits() == 16 && !layer->support_fp16_storage)
        {
            Mat bottom_blob_fp32;
            cast_float16_to_float32(bottom_blob, bottom_blob_fp32, opt);
            bottom_blob = bottom_blob_fp32;
        }
    }
    else
#endif // NCNN_ARM82
#if NCNN_RVV
    if (opt.use_fp16_storage && cpu_support_riscv_v() && cpu_support_riscv_zfh())
    {
        if (bottom_blob.elembits() == 32 && layer->support_fp16_storage)
        {
            Mat bottom_blob_fp16;
            cast_float32_to_float16(bottom_blob, bottom_blob_fp16, opt);
            bottom_blob = bottom_blob_fp16;
        }
        if (bottom_blob.elembits() == 16 && !layer->support_fp16_storage)
        {
            Mat bottom_blob_fp32;
            cast_float16_to_float32(bottom_blob, bottom_blob_fp32, opt);
            bottom_blob = bottom_blob_fp32;
        }
    }
    else
#endif // NCNN_RVV
#if NCNN_BF16
    if (opt.use_bf16_storage)
    {
        if (bottom_blob.elembits() == 32 && layer->support_bf16_storage)
        {
            Mat bottom_blob_bf16;
            cast_float32_to_bfloat16(bottom_blob, bottom_blob_bf16, opt);
            bottom_blob = bottom_blob_bf16;
        }
        if (bottom_blob.elembits() == 16 && !layer->support_bf16_storage)
        {
            Mat bottom_blob_fp32;
            cast_bfloat16_to_float32(bottom_blob, bottom_blob_fp32, opt);
            bottom_blob = bottom_blob_fp32;
        }
    }
    else
#endif // NCNN_BF16
    {
        // no type conversion
    }
    // *INDENT-ON*
    // clang-format on

    if (opt.use_packing_layout)
    {
        // resolve dst_elempack
        int dims = bottom_blob.dims;
        int elemcount = 0;
        if (dims == 1) elemcount = bottom_blob.elempack * bottom_blob.w;
        if (dims == 2) elemcount = bottom_blob.elempack * bottom_blob.h;
        if (dims == 3) elemcount = bottom_blob.elempack * bottom_blob.c;

        int elembits = bottom_blob.elembits();

        int dst_elempack = 1;
        if (layer->support_packing)
        {
            if (elembits == 32)
            {
#if (NCNN_AVX2 || NCNN_AVX)
                if (elemcount % 8 == 0 && (ncnn::cpu_support_x86_avx2() || ncnn::cpu_support_x86_avx()))
                    dst_elempack = 8;
                else if (elemcount % 4 == 0)
                    dst_elempack = 4;
#elif NCNN_RVV
                const int packn = ncnn::cpu_riscv_vlenb() / 4;
                if (elemcount % packn == 0)
                    dst_elempack = packn;
#else
                if (elemcount % 4 == 0)
                    dst_elempack = 4;
#endif
            }
            if (elembits == 16)
            {
#if NCNN_ARM82
                if (elemcount % 8 == 0 && opt.use_fp16_storage && opt.use_fp16_arithmetic && layer->support_fp16_storage)
                    dst_elempack = 8;
                else if (elemcount % 4 == 0)
                    dst_elempack = 4;
#elif NCNN_RVV
                const int packn = ncnn::cpu_riscv_vlenb() / 2;
                if (elemcount % packn == 0)
                    dst_elempack = packn;
#else
                if (elemcount % 4 == 0)
                    dst_elempack = 4;
#endif
            }
            if (elembits == 8)
            {
#if NCNN_RVV
                const int packn = ncnn::cpu_riscv_vlenb() / 1;
                if (elemcount % packn == 0)
                    dst_elempack = packn;
#else
                if (elemcount % 8 == 0)
                    dst_elempack = 8;
#endif
            }
        }

        if (bottom_blob.elempack != dst_elempack)
        {
            Mat bottom_blob_packed;
            convert_packing(bottom_blob, bottom_blob_packed, dst_elempack, opt);
            bottom_blob = bottom_blob_packed;
        }
    }

    return 0;
}